

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall pbrt::SceneEntity::~SceneEntity(SceneEntity *this)

{
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&(this->parameters).params);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SceneEntity() = default;